

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
MyPlanner::MyPlanner
          (MyPlanner *this,string *lower_bound_str,string *base_lower_bound_str,
          string *upper_bound_str,string *base_upper_bound_str)

{
  string asStack_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)lower_bound_str);
  std::__cxx11::string::string(local_58,(string *)base_lower_bound_str);
  std::__cxx11::string::string(local_78,(string *)upper_bound_str);
  std::__cxx11::string::string(asStack_98,(string *)base_lower_bound_str);
  despot::Planner::Planner(&this->super_Planner,local_38,local_58,local_78,asStack_98);
  std::__cxx11::string::~string(asStack_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)this = &PTR__Planner_00121ce8;
  return;
}

Assistant:

MyPlanner(string lower_bound_str,
			string base_lower_bound_str,
			string upper_bound_str,
			string base_upper_bound_str) : Planner(lower_bound_str,
				base_lower_bound_str,
				upper_bound_str,
				base_lower_bound_str) {
  }